

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Path * __thiscall kj::Path::evalWin32(Path *__return_storage_ptr__,Path *this,StringPtr pathText)

{
  char cVar1;
  RemoveConst<kj::String> *pRVar2;
  Path *pPVar3;
  Vector<kj::String> *parts;
  long lVar4;
  String *pSVar5;
  undefined1 fromApi;
  undefined8 in_R9;
  String *p;
  long lVar6;
  size_t sVar7;
  String *pSVar8;
  StringPtr path;
  Vector<kj::String> newParts;
  Vector<kj::String> local_68;
  size_t local_40;
  Path *local_38;
  
  local_40 = pathText.content.size_;
  parts = (Vector<kj::String> *)pathText.content.ptr;
  if ((Vector<kj::String> *)((long)parts + (local_40 - 1)) == parts) {
    lVar6 = 1;
  }
  else {
    lVar6 = 1;
    lVar4 = 0;
    do {
      cVar1 = *(char *)((long)&(parts->builder).ptr + lVar4);
      lVar6 = lVar6 + (ulong)(cVar1 == '\\' || cVar1 == '/');
      lVar4 = lVar4 + 1;
    } while (local_40 - 1 != lVar4);
  }
  sVar7 = lVar6 + (this->parts).size_;
  local_38 = __return_storage_ptr__;
  local_68.builder.ptr =
       (String *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x18,0,sVar7,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  fromApi = (undefined1)in_R9;
  local_68.builder.endPtr = local_68.builder.ptr + sVar7;
  local_68.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  sVar7 = (this->parts).size_;
  local_68.builder.pos = local_68.builder.ptr;
  if (sVar7 != 0) {
    pSVar8 = (this->parts).ptr;
    pSVar5 = pSVar8 + sVar7;
    do {
      if (local_68.builder.pos == local_68.builder.endPtr) {
        sVar7 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr >> 3) *
                0x5555555555555556;
        if (local_68.builder.endPtr == local_68.builder.ptr) {
          sVar7 = 4;
        }
        Vector<kj::String>::setCapacity(&local_68,sVar7);
      }
      fromApi = (undefined1)in_R9;
      ((local_68.builder.pos)->content).ptr = (pSVar8->content).ptr;
      ((local_68.builder.pos)->content).size_ = (pSVar8->content).size_;
      ((local_68.builder.pos)->content).disposer = (pSVar8->content).disposer;
      (pSVar8->content).ptr = (char *)0x0;
      (pSVar8->content).size_ = 0;
      local_68.builder.pos = local_68.builder.pos + 1;
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 != pSVar5);
  }
  pPVar3 = local_38;
  path.content.size_ = 0;
  path.content.ptr = (char *)local_40;
  evalWin32Impl(local_38,(Path *)&local_68,parts,path,(bool)fromApi);
  pSVar5 = local_68.builder.endPtr;
  pRVar2 = local_68.builder.pos;
  pSVar8 = local_68.builder.ptr;
  if (local_68.builder.ptr != (String *)0x0) {
    local_68.builder.ptr = (String *)0x0;
    local_68.builder.pos = (RemoveConst<kj::String> *)0x0;
    local_68.builder.endPtr = (String *)0x0;
    (**(local_68.builder.disposer)->_vptr_ArrayDisposer)
              (local_68.builder.disposer,pSVar8,0x18,
               ((long)pRVar2 - (long)pSVar8 >> 3) * -0x5555555555555555,
               ((long)pSVar5 - (long)pSVar8 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  return pPVar3;
}

Assistant:

Path Path::evalWin32(StringPtr pathText) && {
  Vector<String> newParts(parts.size() + countPartsWin32(pathText));
  for (auto& p: parts) newParts.add(kj::mv(p));
  return evalWin32Impl(kj::mv(newParts), pathText);
}